

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_Empty::_Run(_Test_Empty *this)

{
  WriteBatch *b;
  int local_1ec;
  string local_1e8;
  WriteBatch batch;
  Tester local_1a8;
  
  WriteBatch::WriteBatch(&batch);
  test::Tester::Tester
            (&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
             ,0x3b);
  PrintContents_abi_cxx11_(&local_1e8,(leveldb *)&batch,b);
  test::Tester::IsEq<char[1],std::__cxx11::string>(&local_1a8,(char (*) [1])0x10c022,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  test::Tester::~Tester(&local_1a8);
  test::Tester::Tester
            (&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/write_batch_test.cc"
             ,0x3c);
  local_1e8._M_dataplus._M_p._0_4_ = 0;
  local_1ec = WriteBatchInternal::Count(&batch);
  test::Tester::IsEq<int,int>(&local_1a8,(int *)&local_1e8,&local_1ec);
  test::Tester::~Tester(&local_1a8);
  WriteBatch::~WriteBatch(&batch);
  return;
}

Assistant:

TEST(WriteBatchTest, Empty) {
  WriteBatch batch;
  ASSERT_EQ("", PrintContents(&batch));
  ASSERT_EQ(0, WriteBatchInternal::Count(&batch));
}